

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScriptGenerator.cxx
# Opt level: O2

void __thiscall
cmScriptGenerator::GenerateScriptActionsOnce(cmScriptGenerator *this,ostream *os,Indent indent)

{
  ostream *poVar1;
  string config_test;
  string sStack_38;
  
  if ((this->Configurations).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->Configurations).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    CreateConfigTest(&sStack_38,this,&this->Configurations);
    poVar1 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar1 = std::operator<<(poVar1,"if(");
    poVar1 = std::operator<<(poVar1,(string *)&sStack_38);
    std::operator<<(poVar1,")\n");
    (*this->_vptr_cmScriptGenerator[4])(this,os,(ulong)(indent.Level + 2));
    poVar1 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar1 = std::operator<<(poVar1,"endif(");
    poVar1 = std::operator<<(poVar1,(string *)&sStack_38);
    std::operator<<(poVar1,")\n");
    std::__cxx11::string::~string((string *)&sStack_38);
    return;
  }
  (*this->_vptr_cmScriptGenerator[4])(this,os,(ulong)(uint)indent.Level);
  return;
}

Assistant:

void cmScriptGenerator::GenerateScriptActionsOnce(std::ostream& os,
                                                  Indent indent)
{
  if (this->Configurations.empty()) {
    // This rule is for all configurations.
    this->GenerateScriptActions(os, indent);
  } else {
    // Generate a per-configuration block.
    std::string config_test = this->CreateConfigTest(this->Configurations);
    os << indent << "if(" << config_test << ")\n";
    this->GenerateScriptActions(os, indent.Next());
    os << indent << "endif(" << config_test << ")\n";
  }
}